

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

double maths::Matrix::dotProduct(Matrix *a,Matrix *b)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)a->rows_;
  if (a->rows_ < 1) {
    uVar1 = uVar2;
  }
  dVar3 = 0.0;
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    dVar3 = dVar3 + *a->p[uVar2] * *b->p[uVar2];
  }
  return dVar3;
}

Assistant:

double Matrix::dotProduct(Matrix a, Matrix b)
{
    double sum = 0;
    for (int i = 0; i < a.rows_; ++i) {
        sum += (a(i, 0) * b(i, 0));
    }
    return sum;
}